

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall Session::setSymmetricKey(Session *this,SymmetricKey *inSymmetricKey)

{
  SymmetricAlgorithm *pSVar1;
  
  if (this->symmetricKey != (SymmetricKey *)0x0) {
    pSVar1 = (SymmetricAlgorithm *)this->macOp;
    if ((pSVar1 == (SymmetricAlgorithm *)0x0) &&
       (pSVar1 = this->symmetricCryptoOp, pSVar1 == (SymmetricAlgorithm *)0x0)) {
      return;
    }
    (*pSVar1->_vptr_SymmetricAlgorithm[10])();
  }
  this->symmetricKey = inSymmetricKey;
  return;
}

Assistant:

void Session::setSymmetricKey(SymmetricKey* inSymmetricKey)
{
	if (symmetricKey != NULL)
	{
		if (macOp) {
			macOp->recycleKey(symmetricKey);
		} else if (symmetricCryptoOp) {
			symmetricCryptoOp->recycleKey(symmetricKey);
		} else {
			return;
		}
	}

	symmetricKey = inSymmetricKey;
}